

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

_Bool smtp_endofresp(connectdata *conn,char *line,size_t len,int *resp)

{
  imapstate iVar1;
  int iVar2;
  long slnum;
  ulong uVar3;
  char local_2e [3];
  undefined1 auStack_2b [3];
  
  if (len < 4) {
    return false;
  }
  iVar2 = Curl_isdigit((uint)(byte)*line);
  if (((iVar2 == 0) || (iVar2 = Curl_isdigit((uint)(byte)line[1]), iVar2 == 0)) ||
     (iVar2 = Curl_isdigit((uint)(byte)line[2]), iVar2 == 0)) {
    return false;
  }
  if (len == 5 || line[3] == ' ') {
    uVar3 = (ulong)((uint)(len == 5) * 2);
    memset(auStack_2b + uVar3,0,uVar3 ^ 3);
    memcpy(local_2e,line,uVar3 + 3);
    slnum = strtol(local_2e,(char **)0x0,10);
    iVar2 = curlx_sltosi(slnum);
    if (iVar2 == 1) {
      iVar2 = 0;
    }
    *resp = iVar2;
  }
  else {
    if (line[3] != '-') {
      return false;
    }
    iVar1 = (conn->proto).imapc.state;
    if ((iVar1 != IMAP_LIST) && (iVar1 != IMAP_CAPABILITY)) {
      return false;
    }
    *resp = 1;
  }
  return true;
}

Assistant:

static bool smtp_endofresp(struct connectdata *conn, char *line, size_t len,
                           int *resp)
{
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  bool result = FALSE;

  /* Nothing for us */
  if(len < 4 || !ISDIGIT(line[0]) || !ISDIGIT(line[1]) || !ISDIGIT(line[2]))
    return FALSE;

  /* Do we have a command response? This should be the response code followed
     by a space and optionally some text as per RFC-5321 and as outlined in
     Section 4. Examples of RFC-4954 but some e-mail servers ignore this and
     only send the response code instead as per Section 4.2. */
  if(line[3] == ' ' || len == 5) {
    char tmpline[6];

    result = TRUE;
    memset(tmpline, '\0', sizeof(tmpline));
    memcpy(tmpline, line, (len == 5 ? 5 : 3));
    *resp = curlx_sltosi(strtol(tmpline, NULL, 10));

    /* Make sure real server never sends internal value */
    if(*resp == 1)
      *resp = 0;
  }
  /* Do we have a multiline (continuation) response? */
  else if(line[3] == '-' &&
          (smtpc->state == SMTP_EHLO || smtpc->state == SMTP_COMMAND)) {
    result = TRUE;
    *resp = 1;  /* Internal response code */
  }

  return result;
}